

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

Allocation __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
::inplace_allocate<2ul,false>
          (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
           *this,size_t i_size,size_t i_alignment)

{
  ulong uVar1;
  ControlBlock *pCVar2;
  bool bVar3;
  ulong uVar4;
  uintptr_t uint_pointer;
  void *pvVar5;
  uintptr_t uint_pointer_1;
  ulong i_alignment_00;
  ulong i_size_00;
  Allocation AVar6;
  void *local_50;
  ControlBlock *local_48;
  
  AVar6.m_user_storage = local_50;
  AVar6.m_control_block = local_48;
  if (((i_alignment & i_alignment - 1) != 0) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0xa8c);
  }
  i_alignment_00 = 8;
  if (8 < i_alignment) {
    i_alignment_00 = i_alignment;
  }
  i_size_00 = i_size + 7 & 0xfffffffffffffff8;
  if (7 < i_alignment) {
    i_size_00 = i_size;
  }
  uVar4 = i_alignment_00 - (i_alignment_00 >> 1 & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  do {
    if (*(undefined1 **)(this + 8) != &DAT_0000ffef && ((ulong)*(undefined1 **)(this + 8) & 7) != 0)
    {
      density_tests::detail::assert_failed<>
                ("address_is_aligned(m_tail, min_alignment) || m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
                 ,0xa98);
    }
    pCVar2 = *(ControlBlock **)(this + 8);
    if (1 < (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)) {
      density_tests::detail::assert_failed<>
                ("is_power_of_2(i_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
                 ,0x10a);
    }
    pvVar5 = (void *)((long)&pCVar2->m_next + i_alignment_00 + 7 & -i_alignment_00);
    uVar1 = (long)pvVar5 + i_size_00;
    if (((ulong)pCVar2 & 0xffffffffffff0000 | 0xffe8) < uVar1) {
      if ((i_alignment_00 + i_size_00) - 8 < 0xffd1) {
        heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        ::allocate_new_page((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
                             *)this);
        bVar3 = true;
      }
      else {
        AVar6 = external_allocate<2ul>(this,i_size_00,i_alignment_00);
        bVar3 = false;
      }
    }
    else {
      pCVar2->m_next = uVar1 + 2;
      *(ulong *)(this + 8) = uVar1;
      bVar3 = false;
      AVar6.m_user_storage = pvVar5;
      AVar6.m_control_block = pCVar2;
    }
  } while (bVar3);
  return AVar6;
}

Assistant:

Allocation inplace_allocate(size_t i_size, size_t i_alignment)
        {
            DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

            if (i_alignment < min_alignment)
            {
                i_alignment = min_alignment;
                i_size      = uint_upper_align(i_size, min_alignment);
            }

            for (;;)
            {
                DENSITY_ASSERT_INTERNAL(
                  address_is_aligned(m_tail, min_alignment) ||
                  m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block));

                // allocate space for the control block and the runtime type
                auto const control_block = m_tail;
                void *     new_tail      = address_add(
                  control_block,
                  INCLUDE_TYPE ? (s_sizeof_ControlBlock + s_sizeof_RuntimeType)
                               : s_sizeof_ControlBlock);

                // allocate space for the element
                new_tail                  = address_upper_align(new_tail, i_alignment);
                void * const user_storage = new_tail;
                new_tail                  = address_add(new_tail, i_size);

                // check if a page overflow would occur
                void * end_of_page = get_end_of_page(control_block);
                if (DENSITY_LIKELY(new_tail <= end_of_page))
                {
                    DENSITY_ASSUME(control_block != nullptr);
                    new (control_block) ControlBlock();

                    control_block->m_next = reinterpret_cast<uintptr_t>(new_tail) + CONTROL_BITS;
                    m_tail                = static_cast<ControlBlock *>(new_tail);
                    return Allocation{control_block, user_storage};
                }
                else if (
                  i_size + (i_alignment - min_alignment) <=
                  s_max_size_inpage) // if this allocation may fit in a page
                {
                    // allocate a new page and redo
                    allocate_new_page();
                }
                else
                {
                    // this allocation would never fit in a page, allocate an external block
                    return external_allocate<CONTROL_BITS>(i_size, i_alignment);
                }
            }
        }